

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *
make_word<char16_t,std::__cxx11::u16string>
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,size_t length,char16_t delim)

{
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_30;
  
  local_30._M_string_length = 1;
  local_30.field_2._M_local_buf[1] = L'\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30.field_2._M_local_buf[0] = delim;
  make_word<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_nullptr>
            (__return_storage_ptr__,&local_30,length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT44(local_30.field_2._M_allocated_capacity._4_4_,
                             CONCAT22(local_30.field_2._M_local_buf[1],
                                      local_30.field_2._M_local_buf[0])) * 2 + 2);
  }
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}